

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizes
          (MessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  MessageOptions *this_00;
  FileDescriptor *file;
  LogMessage *other;
  string *psVar3;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  this_00 = Descriptor::options(this->descriptor_);
  bVar2 = MessageOptions::message_set_wire_format(this_00);
  if (bVar2) {
    io::Printer::Print(local_18,
                       "void $classname$::SerializeWithCachedSizes(\n    ::google::protobuf::io::CodedOutputStream* output) const {\n  _extensions_.SerializeMessageSetWithCachedSizes(output);\n"
                       ,"classname",&this->classname_);
    file = Descriptor::file(this->descriptor_);
    bVar2 = UseUnknownFieldSet(file,&this->options_);
    local_51 = 0;
    if (!bVar2) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xe4c);
      local_51 = 1;
      other = internal::LogMessage::operator<<
                        (&local_50,
                         "CHECK failed: UseUnknownFieldSet(descriptor_->file(), options_): ");
      internal::LogFinisher::operator=(local_65,other);
    }
    if ((local_51 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_50);
    }
    io::Printer::Print(local_18,
                       "  ::google::protobuf::internal::WireFormat::SerializeUnknownMessageSetItems(\n      unknown_fields(), output);\n"
                      );
    io::Printer::Print(local_18,"}\n");
  }
  else {
    io::Printer::Print(local_18,
                       "void $classname$::SerializeWithCachedSizes(\n    ::google::protobuf::io::CodedOutputStream* output) const {\n"
                       ,"classname",&this->classname_);
    io::Printer::Indent(local_18);
    pPVar1 = local_18;
    psVar3 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,"// @@protoc_insertion_point(serialize_start:$full_name$)\n",
                       "full_name",psVar3);
    GenerateSerializeWithCachedSizesBody(this,local_18,false);
    pPVar1 = local_18;
    psVar3 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,"// @@protoc_insertion_point(serialize_end:$full_name$)\n","full_name"
                       ,psVar3);
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"}\n");
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizes(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "void $classname$::SerializeWithCachedSizes(\n"
      "    ::google::protobuf::io::CodedOutputStream* output) const {\n"
      "  _extensions_.SerializeMessageSetWithCachedSizes(output);\n",
      "classname", classname_);
    GOOGLE_CHECK(UseUnknownFieldSet(descriptor_->file(), options_));
    printer->Print(
      "  ::google::protobuf::internal::WireFormat::SerializeUnknownMessageSetItems(\n"
      "      unknown_fields(), output);\n");
    printer->Print(
      "}\n");
    return;
  }

  printer->Print(
    "void $classname$::SerializeWithCachedSizes(\n"
    "    ::google::protobuf::io::CodedOutputStream* output) const {\n",
    "classname", classname_);
  printer->Indent();

  printer->Print(
    "// @@protoc_insertion_point(serialize_start:$full_name$)\n",
    "full_name", descriptor_->full_name());

  GenerateSerializeWithCachedSizesBody(printer, false);

  printer->Print(
    "// @@protoc_insertion_point(serialize_end:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print(
    "}\n");
}